

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

string * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator>::GetDefaultPlatformName_abi_cxx11_
          (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string GetDefaultPlatformName() const override { return std::string(); }